

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemiterator_unix.cpp
# Opt level: O3

bool __thiscall
QFileSystemIterator::advance
          (QFileSystemIterator *this,QFileSystemEntry *fileEntry,QFileSystemMetaData *metaData)

{
  Interface *pIVar1;
  long lVar2;
  qsizetype qVar3;
  QArrayData *data;
  char *pcVar4;
  qsizetype qVar5;
  QArrayData *pQVar6;
  char16_t *pcVar7;
  bool bVar8;
  int *piVar9;
  dirent64 *pdVar10;
  size_t sVar11;
  size_t sVar12;
  size_t allocSize;
  QChar *__s;
  size_t sVar13;
  size_t totalCapacity;
  long in_FS_OFFSET;
  QByteArrayView QVar14;
  QStringBuilder<QString_&,_QStringView_&> local_2c0;
  QString local_2b0;
  QStringView local_298;
  QFileSystemEntry local_288;
  QChar local_250 [256];
  QVLABase<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->dir)._M_t.super___uniq_ptr_impl<__dirstream,_QFileSystemIterator::DirStreamCloser>._M_t
      .super__Tuple_impl<0UL,___dirstream_*,_QFileSystemIterator::DirStreamCloser>.
      super__Head_base<0UL,___dirstream_*,_false>._M_head_impl == (__dirstream *)0x0) {
LAB_0017126f:
    bVar8 = false;
  }
  else {
    piVar9 = __errno_location();
    do {
      *piVar9 = 0;
      pdVar10 = readdir64((DIR *)(this->dir)._M_t.
                                 super___uniq_ptr_impl<__dirstream,_QFileSystemIterator::DirStreamCloser>
                                 ._M_t.
                                 super__Tuple_impl<0UL,___dirstream_*,_QFileSystemIterator::DirStreamCloser>
                                 .super__Head_base<0UL,___dirstream_*,_false>._M_head_impl);
      this->dirEntry = (dirent64 *)pdVar10;
      if (pdVar10 == (dirent64 *)0x0) {
        this->lastError = *piVar9;
        goto LAB_0017126f;
      }
      sVar11 = strlen(pdVar10->d_name);
      __s = local_250;
      memset(__s,0xaa,0x200);
      local_50.super_QVLABaseBase.a = 0x100;
      local_50.super_QVLABaseBase.s = 0;
      if (0x100 < (long)sVar11) {
        allocSize = sVar11 * 2;
        local_50.super_QVLABaseBase.a = sVar11;
        local_50.super_QVLABaseBase.ptr = __s;
        sVar12 = QtPrivate::expectedAllocSize(allocSize,0x10);
        sVar13 = sVar11;
        if (sVar12 != 0) {
          sVar13 = sVar12 >> 1;
          allocSize = sVar12 & 0xfffffffffffffffe;
          if (allocSize == 0) {
            __s = (QChar *)0x0;
            local_50.super_QVLABaseBase.a = sVar13;
            goto LAB_0017107b;
          }
        }
        __s = (QChar *)malloc(allocSize);
        local_50.super_QVLABaseBase.a = sVar13;
      }
LAB_0017107b:
      pIVar1 = (this->toUtf16).super_QStringConverter.iface;
      local_50.super_QVLABaseBase.s = sVar11;
      local_50.super_QVLABaseBase.ptr = __s;
      if (pIVar1 == (Interface *)0x0) {
        (this->toUtf16).super_QStringConverter.state.invalidChars = 1;
      }
      else {
        QVar14.m_data = pdVar10->d_name;
        QVar14.m_size = sVar11;
        __s = (*pIVar1->toUtf16)(__s,QVar14,&(this->toUtf16).super_QStringConverter.state);
      }
      sVar13 = (long)__s - (long)local_50.super_QVLABaseBase.ptr >> 1;
      sVar11 = local_50.super_QVLABaseBase.a;
      if (local_50.super_QVLABaseBase.a <= (long)sVar13) {
        sVar11 = sVar13;
      }
      QVLABase<char16_t>::reallocate_impl(&local_50,0x100,local_250,sVar13,sVar11);
      lVar2 = (this->toUtf16).super_QStringConverter.state.invalidChars;
      local_50.super_QVLABaseBase.s = sVar13;
      if (lVar2 == 0) {
        local_298.m_data = (storage_type_conflict *)local_50.super_QVLABaseBase.ptr;
        local_2c0.b = &local_298;
        local_2c0.a = &this->dirPath;
        local_298.m_size = sVar13;
        QStringBuilder<QString_&,_QStringView_&>::convertTo<QString>(&local_2b0,&local_2c0);
        QFileSystemEntry::QFileSystemEntry(&local_288,&local_2b0);
        if (&(local_2b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_2b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_2b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_2b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_2b0.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar6 = &((fileEntry->m_filePath).d.d)->super_QArrayData;
        pcVar7 = (fileEntry->m_filePath).d.ptr;
        (fileEntry->m_filePath).d.d = local_288.m_filePath.d.d;
        (fileEntry->m_filePath).d.ptr = local_288.m_filePath.d.ptr;
        qVar3 = (fileEntry->m_filePath).d.size;
        (fileEntry->m_filePath).d.size = local_288.m_filePath.d.size;
        data = &((fileEntry->m_nativeFilePath).d.d)->super_QArrayData;
        pcVar4 = (fileEntry->m_nativeFilePath).d.ptr;
        (fileEntry->m_nativeFilePath).d.d = local_288.m_nativeFilePath.d.d;
        (fileEntry->m_nativeFilePath).d.ptr = local_288.m_nativeFilePath.d.ptr;
        qVar5 = (fileEntry->m_nativeFilePath).d.size;
        (fileEntry->m_nativeFilePath).d.size = local_288.m_nativeFilePath.d.size;
        fileEntry->m_lastDotInFileName = local_288.m_lastDotInFileName;
        fileEntry->m_lastSeparator = local_288.m_lastSeparator;
        fileEntry->m_firstDotInFileName = local_288.m_firstDotInFileName;
        local_288.m_filePath.d.d = (Data *)pQVar6;
        local_288.m_filePath.d.ptr = pcVar7;
        local_288.m_filePath.d.size = qVar3;
        local_288.m_nativeFilePath.d.d = (Data *)data;
        local_288.m_nativeFilePath.d.ptr = pcVar4;
        local_288.m_nativeFilePath.d.size = qVar5;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,1,0x10);
          }
        }
        if (&(local_288.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_288.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               = ((local_288.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_288.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_288.m_filePath.d.d)->super_QArrayData,2,0x10);
          }
        }
        QFileSystemMetaData::fillFromDirEnt(metaData,this->dirEntry);
      }
      else {
        *piVar9 = 0x54;
      }
      if ((QChar *)local_50.super_QVLABaseBase.ptr != local_250) {
        QtPrivate::sizedFree(local_50.super_QVLABaseBase.ptr,local_50.super_QVLABaseBase.a * 2);
      }
    } while (lVar2 != 0);
    bVar8 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool QFileSystemIterator::advance(QFileSystemEntry &fileEntry, QFileSystemMetaData &metaData)
{
    auto asFileEntry = [this](QStringView name) {
#ifdef Q_OS_DARWIN
        // must match QFile::decodeName
        QString normalized = name.toString().normalized(QString::NormalizationForm_C);
        name = normalized;
#endif
        return QFileSystemEntry(dirPath + name, QFileSystemEntry::FromInternalPath());
    };
    if (!dir)
        return false;

    for (;;) {
        // From readdir man page:
        // If the end of the directory stream is reached, NULL is returned and errno is
        // not changed. If an error occurs, NULL is returned and errno is set to indicate
        // the error. To distinguish end of stream from an error, set errno to zero before
        // calling readdir() and then check the value of errno if NULL is returned.
        errno = 0;
        dirEntry = QT_READDIR(dir.get());

        if (dirEntry) {
            // POSIX allows readdir() to return a file name in struct dirent that
            // extends past the end of the d_name array (it's a char[1] array on QNX, for
            // example). Therefore, we *must* call strlen() on it to get the actual length
            // of the file name. See:
            // https://pubs.opengroup.org/onlinepubs/9699919799/basedefs/dirent.h.html#tag_13_07_05
            QByteArrayView name(dirEntry->d_name, strlen(dirEntry->d_name));
            // name.size() is sufficient here, see QUtf8::convertToUnicode() for details
            QVarLengthArray<char16_t> buffer(name.size());
            auto *end = toUtf16.appendToBuffer(buffer.data(), name);
            buffer.resize(end - buffer.constData());
            if (!toUtf16.hasError()) {
                fileEntry = asFileEntry(buffer);
                metaData.fillFromDirEnt(*dirEntry);
                return true;
            } else {
                errno = EILSEQ; // Invalid or incomplete multibyte or wide character
            }
        } else {
            break;
        }
    }

    lastError = errno;
    return false;
}